

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v8::detail::
       parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  int iVar1;
  char *pcVar2;
  error_handler local_58 [32];
  width_adapter local_38;
  char *local_30;
  char *begin_local;
  
  local_30 = begin;
  if ((byte)(*begin - 0x30U) < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_30,end,-1);
    if (iVar1 == -1) {
      pcVar2 = "number is too big";
LAB_00128ad1:
      error_handler::on_error(local_58,pcVar2);
    }
    ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->width = iVar1;
  }
  else if (*begin == '{') {
    pcVar2 = begin + 1;
    local_30 = pcVar2;
    if (pcVar2 != end) {
      local_38.handler = handler;
      if ((*pcVar2 == ':') || (*pcVar2 == '}')) {
        specs_handler<char>::get_arg(local_58,&handler->super_specs_handler<char>);
        iVar1 = get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
                          ();
        ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->width = iVar1;
        local_30 = pcVar2;
      }
      else {
        local_30 = do_parse_arg_id<char,fmt::v8::detail::parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::width_adapter&>
                             (pcVar2,end,&local_38);
      }
    }
    if ((local_30 == end) || (*local_30 != '}')) {
      pcVar2 = "invalid format string";
      goto LAB_00128ad1;
    }
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}